

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Mode __thiscall
Catch::Clara::Parser::handleMode
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  logic_error *this_00;
  char in_DL;
  size_t in_RSI;
  Parser *in_RDI;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
  *in_stack_00000058;
  string *in_stack_00000060;
  char in_stack_0000006f;
  size_t in_stack_00000070;
  Parser *in_stack_00000078;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
  *in_stack_000000d8;
  string *in_stack_000000e0;
  char in_stack_000000ef;
  size_t in_stack_000000f0;
  Parser *in_stack_000000f8;
  Mode local_4;
  
  switch(in_RDI->mode) {
  case None:
    local_4 = handleNone(in_RDI,in_RSI,in_DL);
    break;
  case MaybeShortOpt:
    local_4 = handleMaybeShortOpt(in_RDI,in_RSI,in_DL);
    break;
  case SlashOpt:
  case ShortOpt:
  case LongOpt:
    local_4 = handleOpt(in_stack_000000f8,in_stack_000000f0,in_stack_000000ef,in_stack_000000e0,
                        in_stack_000000d8);
    break;
  case Positional:
    local_4 = handlePositional(in_stack_00000078,in_stack_00000070,in_stack_0000006f,
                               in_stack_00000060,in_stack_00000058);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown mode");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return local_4;
}

Assistant:

Mode handleMode( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            switch( mode ) {
                case None: return handleNone( i, c );
                case MaybeShortOpt: return handleMaybeShortOpt( i, c );
                case ShortOpt:
                case LongOpt:
                case SlashOpt: return handleOpt( i, c, arg, tokens );
                case Positional: return handlePositional( i, c, arg, tokens );
                default: throw std::logic_error( "Unknown mode" );
            }
        }